

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpls.cpp
# Opt level: O3

Dims * adios2::utils::get_global_array_signature<long>
                 (Dims *__return_storage_ptr__,Engine *fp,IO *io,Variable<long> *variable)

{
  char cVar1;
  pointer puVar2;
  unsigned_long uVar3;
  pointer puVar4;
  undefined8 uVar5;
  void *pvVar6;
  _Rb_tree_node_base *p_Var7;
  long lVar8;
  long lVar9;
  unsigned_long uVar10;
  bool bVar11;
  size_type __n;
  Dims d;
  allocator_type local_69;
  Dims *local_68;
  long local_60;
  pointer local_58;
  pointer puStack_50;
  pointer local_48;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(variable + 0x58);
  local_40 = *(long *)(variable + 0x60);
  __n = local_40 - local_38 >> 3;
  local_58 = (pointer)0x0;
  local_68 = __return_storage_ptr__;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (__return_storage_ptr__,__n,(value_type_conflict1 *)&local_58,&local_69);
  if (timestep == '\x01') {
    adios2::core::VariableBase::Shape((ulong)&local_58);
    puVar2 = (local_68->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    (local_68->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_start = local_58;
    (local_68->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_finish = puStack_50;
    (local_68->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_48;
    local_58 = (pointer)0x0;
    puStack_50 = (pointer)0x0;
    local_48 = (pointer)0x0;
    if ((puVar2 != (pointer)0x0) && (operator_delete(puVar2), local_58 != (pointer)0x0)) {
      operator_delete(local_58);
    }
  }
  else {
    local_60 = adios2::core::VariableBase::GetAvailableStepsCount();
    uVar5 = (**(code **)(*(long *)fp + 0x20))(fp);
    pvVar6 = (void *)(**(code **)(*(long *)fp + 0x58))(fp,variable,uVar5);
    if (pvVar6 == (void *)0x0) {
      p_Var7 = *(_Rb_tree_node_base **)(variable + 0x170);
      if (local_60 != 0 && p_Var7 != (_Rb_tree_node_base *)(variable + 0x160)) {
        bVar11 = true;
        lVar8 = 0;
        do {
          adios2::core::VariableBase::Shape((ulong)&local_58);
          puVar2 = local_58;
          if (local_58 != puStack_50) {
            if (local_40 != local_38) {
              puVar4 = (local_68->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                       ._M_impl.super__Vector_impl_data._M_start;
              lVar9 = 0;
              do {
                if (bVar11) {
                  puVar4[lVar9] = local_58[lVar9];
                }
                else if (puVar4[lVar9] != local_58[lVar9]) {
                  puVar4[lVar9] = 0;
                }
                lVar9 = lVar9 + 1;
              } while (__n + (__n == 0) != lVar9);
            }
            p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
            bVar11 = false;
          }
          if (puVar2 != (pointer)0x0) {
            operator_delete(puVar2);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != local_60);
      }
    }
    else if (local_60 != 0) {
      bVar11 = true;
      lVar8 = 0;
      do {
        if (lVar8 != 0) {
          pvVar6 = (void *)(**(code **)(*(long *)fp + 0x58))(fp,variable,lVar8);
        }
        uVar3 = *(unsigned_long *)((long)pvVar6 + 0x10);
        if (local_40 == local_38 || uVar3 == 0) {
          bVar11 = (bool)(bVar11 & uVar3 == 0);
        }
        else {
          cVar1 = *(char *)((long)pvVar6 + 8);
          puVar2 = (local_68->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          lVar9 = 0;
          do {
            uVar10 = uVar3;
            if (cVar1 == '\0') {
              uVar10 = *(unsigned_long *)(uVar3 + lVar9 * 8);
            }
            if (bVar11) {
LAB_00133c14:
              puVar2[lVar9] = uVar10;
            }
            else if (puVar2[lVar9] != uVar10) {
              uVar10 = 0;
              goto LAB_00133c14;
            }
            lVar9 = lVar9 + 1;
          } while (__n + (__n == 0) != lVar9);
          bVar11 = false;
        }
        if (*(void **)((long)pvVar6 + 0x20) != (void *)0x0) {
          operator_delete(*(void **)((long)pvVar6 + 0x20));
        }
        operator_delete(pvVar6);
        lVar8 = lVar8 + 1;
      } while (lVar8 != local_60);
    }
  }
  return local_68;
}

Assistant:

Dims get_global_array_signature(core::Engine *fp, core::IO *io, core::Variable<T> *variable)
{
    const size_t ndim = variable->m_Shape.size();
    Dims dims(ndim, 0);
    if (timestep)
    {
        dims = variable->Shape();
    }
    else
    {
        const size_t nsteps = variable->GetAvailableStepsCount();
        bool firstStep = true;

        // looping over the absolute step indexes
        // is not supported by a simple API function
        auto minBlocks = fp->MinBlocksInfo(*variable, fp->CurrentStep());

        if (minBlocks)
        {
            for (size_t step = 0; step < nsteps; step++)
            {
                if (step > 0)
                {
                    minBlocks = fp->MinBlocksInfo(*variable, step);
                }
                if (minBlocks->Shape)
                {
                    for (size_t k = 0; k < ndim; k++)
                    {
                        size_t n =
                            (minBlocks->WasLocalValue ? reinterpret_cast<size_t>(minBlocks->Shape)
                                                      : minBlocks->Shape[k]);
                        if (firstStep)
                        {
                            dims[k] = n;
                        }
                        else if (dims[k] != n)
                        {
                            dims[k] = 0;
                        }
                    }
                    firstStep = false;
                }
                delete minBlocks;
            }
        }
        else
        {
            const std::map<size_t, std::vector<size_t>> &indices =
                variable->m_AvailableStepBlockIndexOffsets;
            auto itStep = indices.begin();
            if (itStep != indices.end())
            {
                for (size_t step = 0; step < nsteps; step++)
                {
                    const size_t absstep = itStep->first;
                    Dims d = variable->Shape(absstep - 1);
                    if (d.empty())
                    {
                        continue;
                    }

                    for (size_t k = 0; k < ndim; k++)
                    {
                        if (firstStep)
                        {
                            dims[k] = d[k];
                        }
                        else if (dims[k] != d[k])
                        {
                            dims[k] = 0;
                        }
                    }
                    firstStep = false;
                    ++itStep;
                }
            }
        }
    }
    return dims;
}